

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecUtil.c
# Opt level: O1

void Gia_PolynAnalyzeXors(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vXors;
  int *piVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  ulong uVar6;
  
  vXors = (Vec_Int_t *)malloc(0x10);
  vXors->nCap = 100;
  vXors->nSize = 0;
  piVar3 = (int *)malloc(400);
  vXors->pArray = piVar3;
  if (pGia->pMuxes == (uint *)0x0) {
    puts("AIG does not have XORs extracted.");
    return;
  }
  pVVar4 = pGia->vCos;
  if (pVVar4->nSize < 1) {
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = 0;
    do {
      iVar1 = pVVar4->pArray[uVar6];
      if (((long)iVar1 < 0) || (pGia->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar2 = *(uint *)(pGia->pObjs + iVar1);
      vXors->nSize = 0;
      Gia_ManIncrementTravId(pGia);
      Gia_PolynCollectXors_rec(pGia,iVar1 - (uVar2 & 0x1fffffff),vXors);
      printf("%d=%d  ",uVar6 & 0xffffffff,(ulong)(uint)vXors->nSize);
      uVar5 = uVar5 + vXors->nSize;
      uVar6 = uVar6 + 1;
      pVVar4 = pGia->vCos;
    } while ((long)uVar6 < (long)pVVar4->nSize);
  }
  printf("Total = %d.\n",(ulong)uVar5);
  if (vXors->pArray != (int *)0x0) {
    free(vXors->pArray);
    vXors->pArray = (int *)0x0;
  }
  free(vXors);
  return;
}

Assistant:

void Gia_PolynAnalyzeXors( Gia_Man_t * pGia, int fVerbose )
{
    int i, iDriver, Count = 0;
    Vec_Int_t * vXors = Vec_IntAlloc( 100 );
    if ( pGia->pMuxes == NULL )
    {
        printf( "AIG does not have XORs extracted.\n" );
        return;
    }
    assert( pGia->pMuxes );
    Gia_ManForEachCoDriverId( pGia, iDriver, i )
    {
        Vec_IntClear( vXors );
        Gia_ManIncrementTravId( pGia );
        Gia_PolynCollectXors_rec( pGia, iDriver, vXors );
        //printf( "%3d : ", i );
        //Vec_IntPrint( vXors );
        printf( "%d=%d  ", i, Vec_IntSize(vXors) );
        Count += Vec_IntSize(vXors);
    }
    printf( "Total = %d.\n", Count );
    Vec_IntFree( vXors );
}